

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
args::ValueFlag<double,_args::ValueReader<double>_>::ParseValue
          (ValueFlag<double,_args::ValueReader<double>_> *this,string *value_)

{
  double *in_stack_00000358;
  string *in_stack_00000360;
  string *in_stack_00000368;
  ValueReader<double> *in_stack_00000370;
  
  ValueReader<double>::operator()
            (in_stack_00000370,in_stack_00000368,in_stack_00000360,in_stack_00000358);
  return;
}

Assistant:

virtual void ParseValue(const std::string &value_) override
            {
#ifdef ARGS_NOEXCEPT
                if (!reader(name, value_, this->value))
                {
                    error = Error::Parse;
                }
#else
                reader(name, value_, this->value);
#endif
            }